

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int deleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell,int iHeight)

{
  ulong uVar1;
  int iVar2;
  undefined4 in_ECX;
  int in_EDX;
  RtreeNode *in_RSI;
  Rtree *in_RDI;
  Rtree *unaff_retaddr;
  int rc;
  RtreeNode *pParent;
  RtreeNode *pNode_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = fixLeafParent(unaff_retaddr,
                        (RtreeNode *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar2 == 0) {
    nodeDeleteCell(in_RDI,in_RSI,in_EDX);
    pNode_00 = in_RSI->pParent;
    if (pNode_00 != (RtreeNode *)0x0) {
      iVar2 = readInt16(in_RSI->zData + 2);
      uVar1 = (long)(in_RDI->iNodeSize + -4) / (long)(int)(uint)in_RDI->nBytesPerCell;
      if (iVar2 < (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 3))
      {
        iVar2 = removeNode(in_RDI,in_RSI,in_EDX);
      }
      else {
        iVar2 = fixBoundingBox((Rtree *)CONCAT44(in_EDX,in_ECX),pNode_00);
      }
    }
  }
  return iVar2;
}

Assistant:

static int deleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell, int iHeight){
  RtreeNode *pParent;
  int rc;

  if( SQLITE_OK!=(rc = fixLeafParent(pRtree, pNode)) ){
    return rc;
  }

  /* Remove the cell from the node. This call just moves bytes around
  ** the in-memory node image, so it cannot fail.
  */
  nodeDeleteCell(pRtree, pNode, iCell);

  /* If the node is not the tree root and now has less than the minimum
  ** number of cells, remove it from the tree. Otherwise, update the
  ** cell in the parent node so that it tightly contains the updated
  ** node.
  */
  pParent = pNode->pParent;
  assert( pParent || pNode->iNode==1 );
  if( pParent ){
    if( NCELL(pNode)<RTREE_MINCELLS(pRtree) ){
      rc = removeNode(pRtree, pNode, iHeight);
    }else{
      rc = fixBoundingBox(pRtree, pNode);
    }
  }

  return rc;
}